

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>_>
::Data(Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>_>
       *this,Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>_>
             *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
  *pNVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  R RVar9;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar7 = other->numBuckets;
  sVar8 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar8;
  this->spans = (Span *)0x0;
  RVar9 = allocateSpans(sVar7);
  this->spans = (Span *)RVar9.spans;
  if (RVar9.nSpans != 0) {
    lVar6 = 0;
    sVar7 = 0;
    do {
      pSVar2 = other->spans;
      sVar8 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar8 + lVar6];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar7].entries;
          pNVar5 = Span<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>_>
                   ::insert(this->spans + sVar7,sVar8);
          pNVar5->key = *(AnchorVertex **)pEVar3[bVar1].storage.data;
          pDVar4 = *(Data **)(pEVar3[bVar1].storage.data + 8);
          (pNVar5->value).d = pDVar4;
          if ((pDVar4 != (Data *)0x0) &&
             ((pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
            LOCK();
            (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != 0x80);
      sVar7 = sVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (sVar7 != RVar9.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }